

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O0

void __thiscall jsonChildren::erase(jsonChildren *this,JSONNode ***position)

{
  uint uVar1;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  undefined1 local_e0 [8];
  iteratorKeeper<false> ik;
  json_string local_c0;
  allocator local_99;
  json_string local_98;
  allocator local_71;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  JSONNode ***local_18;
  JSONNode ***position_local;
  jsonChildren *this_local;
  
  local_18 = position;
  position_local = &this->array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Children is null erase",&local_39);
  JSONDebug::_JSON_ASSERT(this != (jsonChildren *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ppJVar2 = this->array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"erasing something from a null array 1",&local_71);
  JSONDebug::_JSON_ASSERT(ppJVar2 != (JSONNode **)0x0,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ppJVar2 = *local_18;
  ppJVar3 = this->array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"position is beneath the start of the array 1",&local_99);
  JSONDebug::_JSON_ASSERT(ppJVar3 <= ppJVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  ppJVar2 = *local_18;
  ppJVar3 = this->array;
  uVar1 = this->mysize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"erasing out of bounds 1",(allocator *)((long)&ik.myPos + 7));
  JSONDebug::_JSON_ASSERT(ppJVar2 <= ppJVar3 + uVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ik.myPos + 7));
  ppJVar2 = *local_18;
  ppJVar3 = *local_18;
  uVar1 = this->mysize;
  this->mysize = uVar1 - 1;
  memmove(ppJVar2,ppJVar3 + 1,(((ulong)uVar1 - ((long)*local_18 - (long)this->array >> 3)) + -1) * 8
         );
  iteratorKeeper<false>::iteratorKeeper((iteratorKeeper<false> *)local_e0,this,local_18);
  shrink(this);
  iteratorKeeper<false>::~iteratorKeeper((iteratorKeeper<false> *)local_e0);
  return;
}

Assistant:

inline void erase(JSONNode ** & position) json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null erase"));
	   JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 1"));
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 1"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("erasing out of bounds 1"));
	   std::memmove(position, position + 1, (mysize-- - (position - array) - 1) * sizeof(JSONNode *));
	   iteratorKeeper<false> ik(this, position);
	   shrink();
    }